

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

void remove_dot_segments(char *inout)

{
  char *pcVar1;
  int iVar2;
  char *pcVar3;
  bool bVar4;
  char *local_28;
  char *in_ahead;
  char *in;
  char *out_end;
  char *inout_local;
  
  in_ahead = inout;
  if (inout != (char *)0x0) {
    for (; pcVar1 = inout, in = inout, *in_ahead != '\0'; in_ahead = in_ahead + 1) {
      if (*in_ahead == '\\') {
        *in_ahead = '/';
      }
    }
    while (in_ahead = pcVar1, *in_ahead != '\0') {
      iVar2 = strncmp(in_ahead,"../",3);
      if (iVar2 == 0) {
        pcVar1 = in_ahead + 3;
      }
      else {
        iVar2 = strncmp(in_ahead,"./",2);
        if (iVar2 == 0) {
          pcVar1 = in_ahead + 2;
        }
        else {
          iVar2 = strncmp(in_ahead,"/./",3);
          if (iVar2 == 0) {
            pcVar1 = in_ahead + 2;
          }
          else {
            iVar2 = strcmp(in_ahead,"/.");
            pcVar1 = in_ahead;
            if (iVar2 == 0) {
              in_ahead[1] = '\0';
            }
            else {
              iVar2 = strncmp(in_ahead,"/../",4);
              if (iVar2 == 0) {
                pcVar1 = in_ahead + 3;
                if (inout != in) {
                  do {
                    in = in + -1;
                    bVar4 = false;
                    if (inout != in) {
                      bVar4 = *in != '/';
                    }
                  } while (bVar4);
                }
              }
              else {
                iVar2 = strcmp(in_ahead,"/..");
                if (iVar2 == 0) {
                  in_ahead[1] = '\0';
                  if (inout != in) {
                    do {
                      in = in + -1;
                      bVar4 = false;
                      if (inout != in) {
                        bVar4 = *in != '/';
                      }
                    } while (bVar4);
                  }
                }
                else {
                  iVar2 = strcmp(in_ahead,".");
                  if ((iVar2 == 0) || (iVar2 = strcmp(in_ahead,".."), iVar2 == 0)) {
                    *in_ahead = '\0';
                  }
                  else {
                    do {
                      *in = *in_ahead;
                      in = in + 1;
                      in_ahead = in_ahead + 1;
                      bVar4 = false;
                      if (*in_ahead != '\0') {
                        bVar4 = *in_ahead != '/';
                      }
                      pcVar1 = in_ahead;
                    } while (bVar4);
                  }
                }
              }
            }
          }
        }
      }
    }
    *in = '\0';
    pcVar1 = inout;
    in = inout;
    while (in_ahead = pcVar1, *in_ahead != '\0') {
      if (*in_ahead == '.') {
        local_28 = in_ahead;
        do {
          local_28 = local_28 + 1;
        } while (*local_28 == '.');
        if (*local_28 == '/') {
          pcVar1 = local_28;
          if ((in != inout) && (pcVar1 = local_28, in[-1] == '/')) {
            in = in + -1;
            pcVar1 = local_28;
          }
        }
        else {
          pcVar1 = local_28;
          if (*local_28 != '\0') {
            do {
              pcVar3 = in + 1;
              *in = '.';
              in_ahead = in_ahead + 1;
              pcVar1 = in_ahead;
              in = pcVar3;
            } while (in_ahead != local_28);
          }
        }
      }
      else {
        if (*in_ahead == '/') {
          *in = '/';
          do {
            in_ahead = in_ahead + 1;
          } while (*in_ahead == '/');
        }
        else {
          *in = *in_ahead;
          in_ahead = in_ahead + 1;
        }
        in = in + 1;
        pcVar1 = in_ahead;
      }
    }
    *in = '\0';
  }
  return;
}

Assistant:

static void
remove_dot_segments(char *inout)
{
	/* Windows backend protection
	 * (https://tools.ietf.org/html/rfc3986#section-7.3): Replace backslash
	 * in URI by slash */
	char *out_end = inout;
	char *in = inout;

	if (!in) {
		/* Param error. */
		return;
	}

	while (*in) {
		if (*in == '\\') {
			*in = '/';
		}
		in++;
	}

	/* Algorithm "remove_dot_segments" from
	 * https://tools.ietf.org/html/rfc3986#section-5.2.4 */
	/* Step 1:
	 * The input buffer is initialized.
	 * The output buffer is initialized to the empty string.
	 */
	in = inout;

	/* Step 2:
	 * While the input buffer is not empty, loop as follows:
	 */
	/* Less than out_end of the inout buffer is used as output, so keep
	 * condition: out_end <= in */
	while (*in) {
		/* Step 2a:
		 * If the input buffer begins with a prefix of "../" or "./",
		 * then remove that prefix from the input buffer;
		 */
		if (!strncmp(in, "../", 3)) {
			in += 3;
		} else if (!strncmp(in, "./", 2)) {
			in += 2;
		}
		/* otherwise */
		/* Step 2b:
		 * if the input buffer begins with a prefix of "/./" or "/.",
		 * where "." is a complete path segment, then replace that
		 * prefix with "/" in the input buffer;
		 */
		else if (!strncmp(in, "/./", 3)) {
			in += 2;
		} else if (!strcmp(in, "/.")) {
			in[1] = 0;
		}
		/* otherwise */
		/* Step 2c:
		 * if the input buffer begins with a prefix of "/../" or "/..",
		 * where ".." is a complete path segment, then replace that
		 * prefix with "/" in the input buffer and remove the last
		 * segment and its preceding "/" (if any) from the output
		 * buffer;
		 */
		else if (!strncmp(in, "/../", 4)) {
			in += 3;
			if (inout != out_end) {
				/* remove last segment */
				do {
					out_end--;
				} while ((inout != out_end) && (*out_end != '/'));
			}
		} else if (!strcmp(in, "/..")) {
			in[1] = 0;
			if (inout != out_end) {
				/* remove last segment */
				do {
					out_end--;
				} while ((inout != out_end) && (*out_end != '/'));
			}
		}
		/* otherwise */
		/* Step 2d:
		 * if the input buffer consists only of "." or "..", then remove
		 * that from the input buffer;
		 */
		else if (!strcmp(in, ".") || !strcmp(in, "..")) {
			*in = 0;
		}
		/* otherwise */
		/* Step 2e:
		 * move the first path segment in the input buffer to the end of
		 * the output buffer, including the initial "/" character (if
		 * any) and any subsequent characters up to, but not including,
		 * the next "/" character or the end of the input buffer.
		 */
		else {
			do {
				*out_end = *in;
				out_end++;
				in++;
			} while ((*in != 0) && (*in != '/'));
		}
	}

	/* Step 3:
	 * Finally, the output buffer is returned as the result of
	 * remove_dot_segments.
	 */
	/* Terminate output */
	*out_end = 0;

	/* For Windows, the files/folders "x" and "x." (with a dot but without
	 * extension) are identical. Replace all "./" by "/" and remove a "." at
	 * the end. Also replace all "//" by "/". Repeat until there is no "./"
	 * or "//" anymore.
	 */
	out_end = in = inout;
	while (*in) {
		if (*in == '.') {
			/* remove . at the end or preceding of / */
			char *in_ahead = in;
			do {
				in_ahead++;
			} while (*in_ahead == '.');
			if (*in_ahead == '/') {
				in = in_ahead;
				if ((out_end != inout) && (out_end[-1] == '/')) {
					/* remove generated // */
					out_end--;
				}
			} else if (*in_ahead == 0) {
				in = in_ahead;
			} else {
				do {
					*out_end++ = '.';
					in++;
				} while (in != in_ahead);
			}
		} else if (*in == '/') {
			/* replace // by / */
			*out_end++ = '/';
			do {
				in++;
			} while (*in == '/');
		} else {
			*out_end++ = *in;
			in++;
		}
	}
	*out_end = 0;
}